

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

bool __thiscall VcprojGenerator::isStandardSuffix(VcprojGenerator *this,QString *suffix)

{
  bool bVar1;
  int iVar2;
  QString *in_RSI;
  long in_FS_OFFSET;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  QMakeProject *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff28;
  bool local_99;
  undefined1 local_98 [24];
  undefined1 local_80 [48];
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  QMakeProject::values
            ((QMakeProject *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (ProKey *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x28a0fa);
  ProKey::~ProKey((ProKey *)0x28a10d);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QString::QString((QString *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffffef8,
                       (QString *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       (bool)in_stack_fffffffffffffeef);
    QString::~QString((QString *)0x28a1bc);
    if (bVar1) {
      QString::QString((QString *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
      iVar2 = QString::compare((QString *)in_RSI,(CaseSensitivity)local_80);
      QString::~QString((QString *)0x28a209);
      if (iVar2 == 0) {
        local_99 = true;
        goto LAB_0028a277;
      }
    }
    else {
      QString::QString(in_RSI,in_stack_ffffffffffffff28);
      iVar2 = QString::compare((QString *)in_RSI,(CaseSensitivity)local_98);
      QString::~QString((QString *)0x28a25e);
      if (iVar2 == 0) {
        local_99 = true;
        goto LAB_0028a277;
      }
    }
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffef8,(char *)in_RSI);
    iVar2 = QString::compare((QString *)in_RSI,(CaseSensitivity)local_50);
    QString::~QString((QString *)0x28a15a);
    if (iVar2 == 0) {
      local_99 = true;
      goto LAB_0028a277;
    }
  }
  local_99 = false;
LAB_0028a277:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_99;
}

Assistant:

bool VcprojGenerator::isStandardSuffix(const QString &suffix) const
{
    if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        if (suffix.compare("exe", Qt::CaseInsensitive) == 0)
            return true;
    } else if (project->isActiveConfig("shared")) {
        if (suffix.compare("dll", Qt::CaseInsensitive) == 0)
            return true;
    } else {
        if (suffix.compare("lib", Qt::CaseInsensitive) == 0)
            return true;
    }
    return false;
}